

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::IsConical(ON_RevSurface *this,ON_Cone *cone,double tolerance)

{
  bool bVar1;
  ON_3dVector local_170;
  double local_158;
  double d;
  ON_3dVector local_138;
  double local_120;
  double dr;
  double local_110;
  double h;
  double r [2];
  undefined1 local_e8 [8];
  ON_Line line;
  ON_Cone c;
  double tolerance_local;
  ON_Cone *cone_local;
  ON_RevSurface *this_local;
  
  c.radius = tolerance;
  ON_Cone::ON_Cone((ON_Cone *)&line.to.z);
  ON_Line::ON_Line((ON_Line *)local_e8);
  h = 0.0;
  r[0] = 0.0;
  local_110 = 0.0;
  bVar1 = ON_IsValid(c.radius);
  if ((!bVar1) || (c.radius <= 0.0)) {
    c.radius = 2.3283064365386963e-10;
  }
  bVar1 = ON__IsCylConeHelper(&this->m_axis,this->m_curve,c.radius,(ON_Plane *)&line.to.z,
                              (ON_Line *)local_e8,&h,&local_110);
  if (bVar1) {
    local_120 = h - r[0];
    if (2.3283064365386963e-10 < ABS(local_120)) {
      if ((h != 0.0) || (NAN(h))) {
        if ((r[0] != 0.0) || (NAN(r[0]))) {
          if (local_120 <= 0.0) {
            local_158 = (local_110 * h) / local_120;
            ::operator*(&local_170,local_158,(ON_3dVector *)&c.plane.yaxis.z);
            ON_3dPoint::operator+=((ON_3dPoint *)&line.to.z,&local_170);
            ON_Plane::UpdateEquation((ON_Plane *)&line.to.z);
            c.height = r[0];
            c.plane.plane_equation.d = local_110 - local_158;
          }
          else {
            local_110 = local_110 * (h / local_120);
            ::operator*((ON_3dVector *)&d,local_110,(ON_3dVector *)&c.plane.yaxis.z);
            ON_3dPoint::operator+=((ON_3dPoint *)&line.to.z,(ON_3dVector *)&d);
            ON_Plane::UpdateEquation((ON_Plane *)&line.to.z);
            c.height = h;
            c.plane.plane_equation.d = -local_110;
          }
        }
        else {
          ::operator*(&local_138,local_110,(ON_3dVector *)&c.plane.yaxis.z);
          ON_3dPoint::operator+=((ON_3dPoint *)&line.to.z,&local_138);
          ON_Plane::UpdateEquation((ON_Plane *)&line.to.z);
          c.height = h;
          c.plane.plane_equation.d = -local_110;
        }
      }
      else {
        c.height = r[0];
        c.plane.plane_equation.d = local_110;
      }
      if (cone != (ON_Cone *)0x0) {
        memcpy(cone,&line.to.z,0x90);
      }
      this_local._7_1_ = ON_Cone::IsValid((ON_Cone *)&line.to.z);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  dr._4_4_ = 1;
  ON_Line::~ON_Line((ON_Line *)local_e8);
  ON_Cone::~ON_Cone((ON_Cone *)&line.to.z);
  return this_local._7_1_;
}

Assistant:

bool ON_RevSurface::IsConical(
      ON_Cone* cone,
      double tolerance
      ) const
{
  ON_Cone c;
  ON_Line line;
  double r[2] = {0.0,0.0};
  double h = 0.0;
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  if ( !ON__IsCylConeHelper(m_axis,m_curve,tolerance,c.plane,line,r,h) )
    return false;
  double dr = r[0]-r[1];
  if ( fabs(dr) <= ON_ZERO_TOLERANCE )
    return false;
  if ( 0.0 == r[0] )
  {
    c.radius = r[1];
    c.height = h;
  }
  else if ( 0.0 == r[1] )
  {
    c.plane.origin += h*c.plane.zaxis;
    c.plane.UpdateEquation();
    c.radius = r[0];
    c.height = -h;
  }
  else if ( dr > 0.0 )
  {
    h *= (r[0]/dr);
    c.plane.origin += h*c.plane.zaxis;
    c.plane.UpdateEquation();
    c.radius = r[0];
    c.height = -h;
  }
  else
  {
    double d = h*r[0]/dr;
    c.plane.origin += d*c.plane.zaxis;
    c.plane.UpdateEquation();
    c.radius = r[1];
    c.height = h-d;
  }

  if ( cone )
    *cone = c;
  return c.IsValid();
}